

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int is_whitespace(char *s,int len)

{
  ulong uVar1;
  
  if (s == (char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x35,"int is_whitespace(const char *, int)");
  }
  if (0 < len) {
    uVar1 = 0;
    do {
      if ((0x20 < (ulong)(byte)s[uVar1]) ||
         ((0x100002600U >> ((ulong)(byte)s[uVar1] & 0x3f) & 1) == 0)) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return 1;
}

Assistant:

static int is_whitespace(const char *s, int len)
{
    int i;

    assert(s != NULL);

    for (i = 0; i < len; i++)
    {
        if (s[i] != ' ' && s[i] != '\t' && s[i] != '\n' && s[i] != '\r')
        {
            return 0;
        }
    }

    return 1;
}